

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

int getflag(int argc,char **argv,char *flags)

{
  char cVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char **ppcVar6;
  int iVar7;
  char **ppcVar8;
  char **ppcVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  
  iVar3 = flagind;
  flagarg = (char *)0x0;
  lVar13 = (long)flagind;
  iVar12 = flagind;
  if ((flagind < argc) && (*argv[lVar13] != '-')) {
    ppcVar6 = argv + lVar13;
    iVar11 = flagind;
    do {
      ppcVar6 = ppcVar6 + 1;
      iVar12 = iVar11 + 1;
      if (argc + -1 == iVar11) {
        flagarg = (char *)0x0;
        return -1;
      }
      iVar11 = iVar12;
    } while (**ppcVar6 != '-');
  }
  flagind = iVar12;
  iVar12 = flagind;
  if (flagind == argc) {
    flagind = iVar3;
    flagarg = (char *)0x0;
    return -1;
  }
  lVar10 = (long)flagind;
  pcVar5 = argv[lVar10];
  cVar1 = pcVar5[1];
  iVar7 = (int)cVar1;
  iVar11 = iVar12;
  if (iVar7 == 0x2d) {
    if (pcVar5[2] == '\0') {
      iVar7 = -1;
    }
    else {
      flagflag = 0x2d;
LAB_00110ec0:
      iVar7 = flagflag;
      if (pcVar5[2] == '\0') {
        pcVar5 = strchr(flags,flagflag);
        if (pcVar5 == (char *)0x0) {
LAB_00110f42:
          iVar7 = 0x3f;
        }
        else if (pcVar5[1] == ':') {
          iVar11 = iVar12 + 1;
          if (iVar11 == argc) {
            iVar4 = iVar12 + 1;
            iVar7 = 0x3f;
            iVar12 = iVar3;
            goto LAB_00111000;
          }
          flagarg = argv[iVar11];
        }
      }
      else {
        flagarg = pcVar5 + 2;
        pcVar5 = strchr(flags,flagflag);
        if (pcVar5 == (char *)0x0) goto LAB_00110f42;
        if (pcVar5[1] != ':') {
          iVar7 = 0x3f;
        }
      }
    }
  }
  else {
    flagflag = iVar7;
    if ((cVar1 != '\0') && (cVar1 != ':')) goto LAB_00110ec0;
    iVar7 = 0x3f;
  }
  iVar4 = iVar11 + 1;
  if (iVar3 < iVar12 && iVar12 <= iVar11) {
    ppcVar6 = argv + lVar10 + -1;
    if (argv + lVar13 < ppcVar6) {
      ppcVar2 = argv + lVar13;
      do {
        ppcVar9 = ppcVar2 + 1;
        pcVar5 = *ppcVar2;
        *ppcVar2 = *ppcVar6;
        *ppcVar6 = pcVar5;
        ppcVar6 = ppcVar6 + -1;
        ppcVar2 = ppcVar9;
      } while (ppcVar9 < ppcVar6);
    }
    ppcVar6 = argv + (long)iVar4 + -1;
    if (argv + lVar10 < ppcVar6) {
      ppcVar9 = ppcVar6;
      ppcVar2 = argv + lVar10;
      do {
        ppcVar8 = ppcVar2 + 1;
        pcVar5 = *ppcVar2;
        *ppcVar2 = *ppcVar9;
        *ppcVar9 = pcVar5;
        ppcVar9 = ppcVar9 + -1;
        ppcVar2 = ppcVar8;
      } while (ppcVar8 < ppcVar9);
    }
    if (argv + lVar13 < ppcVar6) {
      ppcVar2 = argv + lVar13;
      do {
        ppcVar9 = ppcVar2 + 1;
        pcVar5 = *ppcVar2;
        *ppcVar2 = *ppcVar6;
        *ppcVar6 = pcVar5;
        ppcVar6 = ppcVar6 + -1;
        ppcVar2 = ppcVar9;
      } while (ppcVar9 < ppcVar6);
    }
  }
LAB_00111000:
  flagind = (iVar4 + iVar3) - iVar12;
  return iVar7;
}

Assistant:

int getflag(int argc, char **argv, const char *flags)
{
    int argstart, flagstart, c;
    const char *flagp;

    c = -1;
    flagarg = NULL;
    argstart = flagind;
    flagstart = argc;

    /* skip over non-flags */
    while (flagind < argc && argv[flagind][0] != '-')
    {
        ++flagind;
    }
    if (flagind == argc)
    {
        /* no more args */
        flagind = argstart;
        return c;
    }
    /* we have an arg to work with */
    do
    {
        flagstart = flagind;
        if (argv[flagind][1] == '-' && argv[flagind][2] == '\0')
        {
            /* stop parsing at '--' flag */
            break;
        }
        c = flagflag = argv[flagind][1];
        if (c == ':' || c == '\0')
        {
            /* this is an illegal flag */
            c = '?';
            break;
        }
        /* flag with arg */
        if (argv[flagind][2] != '\0')
        {
            /* flag-arg in same argv[] */
            flagarg = argv[flagind] + 2;
        }
        flagp = strchr(flags, c);
        if (flagp == NULL)
        {
            /* this is an unknown flag */
            c = '?';
            break;
        }
        if (flagarg != NULL || flagp[1] != ':')
        {
            if (flagarg != NULL && flagp[1] != ':')
            {
                /* error, a simple flag with an argument */
                c = '?';
            }
            break;
        }

        /* flag-arg is in the next argv[] */
        if (flagind + 1 == argc)
        {
            /* auahh, no flag-arg */
            flagstart = argstart;
            c = '?';
            break;
        }
        flagarg = argv[++flagind];
    } while (0);
    /* skip to next arg */
    ++flagind;

    if (flagstart < flagind && argstart < flagstart)
    {
        /* we have found some args
         * we have also skipped over some non-args
         * shuffle the non-flag arg to the end of argv */
        reverse(argv, argstart, flagstart);
        reverse(argv, flagstart, flagind);
        reverse(argv, argstart, flagind);
    }
    flagind = argstart + flagind - flagstart;

    return c;
}